

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeval.c
# Opt level: O0

timediff_t Curl_timediff_us(curltime newer,curltime older)

{
  long lVar1;
  timediff_t diff;
  curltime older_local;
  curltime newer_local;
  
  lVar1 = newer.tv_sec - older.tv_sec;
  if (lVar1 < 0x8637bd05af6) {
    if (lVar1 < -0x8637bd05af5) {
      newer_local.tv_usec = 0;
      newer_local._12_4_ = 0x80000000;
    }
    else {
      newer_local._8_8_ = (lVar1 * 1000000 + (long)newer.tv_usec) - (long)older.tv_usec;
    }
  }
  else {
    newer_local.tv_usec = -1;
    newer_local._12_4_ = 0x7fffffff;
  }
  return newer_local._8_8_;
}

Assistant:

timediff_t Curl_timediff_us(struct curltime newer, struct curltime older)
{
  timediff_t diff = (timediff_t)newer.tv_sec-older.tv_sec;
  if(diff >= (TIMEDIFF_T_MAX/1000000))
    return TIMEDIFF_T_MAX;
  else if(diff <= (TIMEDIFF_T_MIN/1000000))
    return TIMEDIFF_T_MIN;
  return diff * 1000000 + newer.tv_usec-older.tv_usec;
}